

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_57051::StatTest::StatTest(StatTest *this)

{
  StatTest *this_local;
  
  StateTestWithBuiltinRules::StateTestWithBuiltinRules(&this->super_StateTestWithBuiltinRules);
  DiskInterface::DiskInterface(&this->super_DiskInterface);
  (this->super_StateTestWithBuiltinRules).super_Test._vptr_Test =
       (_func_int **)&PTR__StatTest_002a5260;
  (this->super_DiskInterface).super_FileReader._vptr_FileReader =
       (_func_int **)&PTR__StatTest_002a52c0;
  DependencyScan::DependencyScan
            (&this->scan_,&(this->super_StateTestWithBuiltinRules).state_,(BuildLog *)0x0,
             (DepsLog *)0x0,&this->super_DiskInterface,(DepfileParserOptions *)0x0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map(&this->mtimes_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->stats_);
  return;
}

Assistant:

StatTest() : scan_(&state_, NULL, NULL, this, NULL) {}